

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

bool __thiscall glslang::TArraySizes::isInnerUnsized(TArraySizes *this)

{
  int iVar1;
  uint uVar2;
  int local_1c;
  int d;
  TArraySizes *this_local;
  
  local_1c = 1;
  while( true ) {
    iVar1 = TSmallArrayVector::size(&this->sizes);
    if (iVar1 <= local_1c) {
      return false;
    }
    uVar2 = TSmallArrayVector::getDimSize(&this->sizes,local_1c);
    if (uVar2 == 0) break;
    local_1c = local_1c + 1;
  }
  return true;
}

Assistant:

bool isInnerUnsized() const
    {
        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimSize(d) == (unsigned)UnsizedArraySize)
                return true;
        }

        return false;
    }